

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

bool __thiscall QMdiSubWindow::event(QMdiSubWindow *this,QEvent *event)

{
  QIcon *windowIcon;
  bool bVar1;
  ushort uVar2;
  ColorGroup CVar3;
  int iVar4;
  int iVar5;
  QMdiSubWindowPrivate *this_00;
  QSize QVar6;
  QWidgetData *pQVar7;
  Data *pDVar8;
  QMdiSubWindowPrivate *pQVar9;
  undefined1 auVar10 [8];
  bool bVar11;
  bool bVar12;
  char cVar13;
  bool bVar14;
  int iVar15;
  QWidget *pQVar16;
  QStyle *pQVar17;
  QProxyStyle *this_01;
  long lVar18;
  QWidget *pQVar19;
  Representation RVar20;
  QObject *pQVar21;
  Representation RVar22;
  long in_FS_OFFSET;
  QLatin1String QVar23;
  QIcon moved;
  undefined1 local_b0 [8];
  undefined1 local_a8 [12];
  Representation local_9c;
  QArrayData *local_60;
  QIcon local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  uVar2 = *(ushort *)(event + 8);
  if (uVar2 < 0x61) {
    if (0x21 < uVar2) {
      if (uVar2 < 0x4c) {
        if (uVar2 == 0x22) {
          QWidget::windowIcon((QWidget *)local_b0);
          auVar10 = local_b0;
          windowIcon = &this_00->menuIcon;
          local_b0 = (undefined1  [8])0x0;
          local_a8._0_8_ = (this_00->menuIcon).d;
          (this_00->menuIcon).d = (QIconPrivate *)auVar10;
          QIcon::~QIcon((QIcon *)local_a8);
          QIcon::~QIcon((QIcon *)local_b0);
          cVar13 = QIcon::isNull();
          if (cVar13 != '\0') {
            pQVar17 = QWidget::style(&this->super_QWidget);
            (**(code **)(*(long *)pQVar17 + 0x100))((QIcon *)local_b0,pQVar17,0,0,this);
            auVar10 = local_b0;
            local_b0 = (undefined1  [8])0x0;
            local_a8._0_8_ = windowIcon->d;
            windowIcon->d = (QIconPrivate *)auVar10;
            QIcon::~QIcon((QIcon *)local_a8);
            QIcon::~QIcon((QIcon *)local_b0);
          }
          pDVar8 = (this_00->controlContainer).wp.d;
          if (((pDVar8 != (Data *)0x0) && (*(int *)(pDVar8 + 4) != 0)) &&
             ((this_00->controlContainer).wp.value != (QObject *)0x0)) {
            QMdi::ControlContainer::updateWindowIcon
                      ((ControlContainer *)(this_00->controlContainer).wp.value,windowIcon);
          }
          pQVar16 = maximizedSystemMenuIconWidget(this);
          if (pQVar16 == (QWidget *)0x0) {
            pQVar7 = (this->super_QWidget).data;
            iVar4 = (pQVar7->crect).x2.m_i;
            iVar5 = (pQVar7->crect).x1.m_i;
            iVar15 = QMdiSubWindowPrivate::titleBarHeight(this_00);
            local_a8._0_4_ = 0;
            local_a8._4_4_ = 0;
            local_9c.m_i = iVar15 + -1;
            local_a8._8_4_ = iVar4 - iVar5;
            QWidget::update(&this->super_QWidget,(QRect *)local_a8);
          }
        }
        else if (uVar2 == 0x27) {
          QMdiSubWindowPrivate::desktopPalette((QMdiSubWindowPrivate *)local_a8);
          CVar3 = (this_00->titleBarPalette).currentGroup;
          (this_00->titleBarPalette).currentGroup = local_a8._8_4_;
          QVar6 = (QSize)(this_00->titleBarPalette).d;
          (this_00->titleBarPalette).d = (QPalettePrivate *)local_a8._0_8_;
          local_a8._0_8_ = QVar6;
          local_a8._8_4_ = CVar3;
          QPalette::~QPalette((QPalette *)local_a8);
        }
      }
      else if (uVar2 == 0x4c) {
        QMdiSubWindowPrivate::updateGeometryConstraints(this_00);
      }
      else if (uVar2 == 0x5a) {
        QMdiSubWindowPrivate::updateDirtyRegions(this_00);
      }
      goto LAB_00458cb9;
    }
    if (0x18 < uVar2) {
      if (uVar2 != 0x19) {
        if (uVar2 != 0x21) goto LAB_00458cb9;
        if (this_00->ignoreWindowTitleChange == false) {
          QMdiSubWindowPrivate::updateWindowTitle(this_00,false);
        }
        goto LAB_00458c0f;
      }
      if (this_00->ignoreNextActivationEvent == true) {
LAB_00458a63:
        this_00->ignoreNextActivationEvent = false;
        goto LAB_00458cb9;
      }
      this_00->isExplicitlyDeactivated = true;
      goto LAB_00458b0f;
    }
    if (uVar2 == 0x15) {
      bVar14 = QWidget::testAttribute_helper(&this->super_QWidget,WA_Resized);
      QMdiSubWindowPrivate::removeButtonsFromMenuBar(this_00);
      this_00->currentOperation = None;
      this_00->hoveredSubControl = SC_None;
      this_00->activeSubControl = SC_None;
      if (this_00->isInRubberBandMode == true) {
        QMdiSubWindowPrivate::leaveRubberBandMode(this_00);
      }
      this_00->isShadeMode = false;
      this_00->isMaximizeMode = false;
      this_00->isWidgetHiddenByUs = false;
      if (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10) == 0) {
        pQVar17 = QWidget::style(&this->super_QWidget);
        this_01 = (QProxyStyle *)QMetaObject::cast((QObject *)&QProxyStyle::staticMetaObject);
        if (this_01 != (QProxyStyle *)0x0) {
          pQVar17 = QProxyStyle::baseStyle(this_01);
        }
        lVar18 = (**(code **)(*(long *)pQVar17 + 8))();
        if (lVar18 != 0) {
          pDVar8 = (this_00->sizeGrip).wp.d;
          if ((pDVar8 == (Data *)0x0) || (*(int *)(pDVar8 + 4) == 0)) {
            pQVar21 = (QObject *)0x0;
          }
          else {
            pQVar21 = (this_00->sizeGrip).wp.value;
          }
          if (pQVar21 != (QObject *)0x0) {
            (**(code **)(*(long *)pQVar21 + 0x20))();
          }
        }
        pQVar9 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
        (pQVar9->options).super_QFlagsStorageHelper<QMdiSubWindow::SubWindowOption,_4>.
        super_QFlagsStorage<QMdiSubWindow::SubWindowOption>.i =
             (pQVar9->options).super_QFlagsStorageHelper<QMdiSubWindow::SubWindowOption,_4>.
             super_QFlagsStorage<QMdiSubWindow::SubWindowOption>.i & 0xfffffffb;
        if (pQVar9->isInRubberBandMode == true) {
          QMdiSubWindowPrivate::leaveRubberBandMode(pQVar9);
        }
        pQVar9 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
        (pQVar9->options).super_QFlagsStorageHelper<QMdiSubWindow::SubWindowOption,_4>.
        super_QFlagsStorage<QMdiSubWindow::SubWindowOption>.i =
             (pQVar9->options).super_QFlagsStorageHelper<QMdiSubWindow::SubWindowOption,_4>.
             super_QFlagsStorage<QMdiSubWindow::SubWindowOption>.i & 0xfffffff7;
        if (pQVar9->isInRubberBandMode == true) {
          QMdiSubWindowPrivate::leaveRubberBandMode(pQVar9);
        }
      }
      else {
        (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0x28))(this_00);
      }
      QWidget::setContentsMargins(&this->super_QWidget,0,0,0,0);
      QMdiSubWindowPrivate::updateGeometryConstraints(this_00);
      QMdiSubWindowPrivate::updateCursor(this_00);
      QMdiSubWindowPrivate::updateMask(this_00);
      QMdiSubWindowPrivate::updateDirtyRegions(this_00);
      QMdiSubWindowPrivate::updateActions(this_00);
      if ((!bVar14) &&
         (bVar14 = QWidget::testAttribute_helper(&this->super_QWidget,WA_Resized), bVar14)) {
        QWidget::setAttribute(&this->super_QWidget,WA_Resized,false);
      }
      goto LAB_00458cb9;
    }
    if (uVar2 != 0x18) goto LAB_00458cb9;
    if (this_00->ignoreNextActivationEvent == true) goto LAB_00458a63;
    this_00->isExplicitlyDeactivated = false;
    bVar14 = true;
  }
  else {
    if (uVar2 < 0x6e) {
      if (uVar2 == 0x61) {
        QFont::operator=(&this_00->font,&((this->super_QWidget).data)->fnt);
        goto LAB_00458cb9;
      }
      if (uVar2 == 100) {
        bVar14 = this_00->isShadeMode;
        bVar11 = QWidget::isMinimized(&this->super_QWidget);
        bVar12 = QWidget::isMaximized(&this->super_QWidget);
        bVar1 = this_00->activationEnabled;
        this_00->activationEnabled = false;
        QWidget::ensurePolished(&this->super_QWidget);
        QWidget::setContentsMargins(&this->super_QWidget,0,0,0,0);
        if (((bVar11 || bVar12) | bVar14) == 1) {
          QWidget::showNormal(&this->super_QWidget);
        }
        QMdiSubWindowPrivate::updateGeometryConstraints(this_00);
        pQVar7 = (this->super_QWidget).data;
        RVar20.m_i = ((pQVar7->crect).x2.m_i - (pQVar7->crect).x1.m_i) + 1;
        RVar22.m_i = ((pQVar7->crect).y2.m_i - (pQVar7->crect).y1.m_i) + 1;
        iVar4 = (this_00->internalMinimumSize).wd.m_i;
        if (RVar20.m_i < iVar4) {
          RVar20.m_i = iVar4;
        }
        iVar4 = (this_00->internalMinimumSize).ht.m_i;
        if (RVar22.m_i < iVar4) {
          RVar22.m_i = iVar4;
        }
        local_a8._4_4_ = RVar22.m_i;
        local_a8._0_4_ = RVar20.m_i;
        QWidget::resize(&this->super_QWidget,(QSize *)local_a8);
        QMdiSubWindowPrivate::updateMask(this_00);
        QMdiSubWindowPrivate::updateDirtyRegions(this_00);
        if (bVar14 == false) {
          if (bVar11) {
            QWidget::showMinimized(&this->super_QWidget);
          }
          else if (bVar12) {
            QWidget::showMaximized(&this->super_QWidget);
          }
        }
        else {
          showShaded(this);
        }
        this_00->activationEnabled = bVar1;
        goto LAB_00458cb9;
      }
      if (uVar2 != 0x66) goto LAB_00458cb9;
      QWidget::windowTitle((QString *)local_a8,&this->super_QWidget);
      QVar23.m_data = (char *)0x3;
      QVar23.m_size = (qsizetype)local_a8;
      lVar18 = QString::indexOf(QVar23,0x6747ec,CaseInsensitive);
      if ((QSize)local_a8._0_8_ != (QSize)0x0) {
        LOCK();
        *(int *)local_a8._0_8_ = *(int *)local_a8._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_a8._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
        }
      }
      if (lVar18 == -1) goto LAB_00458cb9;
      pQVar16 = maximizedButtonsWidget(this);
      if (pQVar16 != (QWidget *)0x0) {
        pDVar8 = (this_00->controlContainer).wp.d;
        if ((pDVar8 == (Data *)0x0) || (*(int *)(pDVar8 + 4) == 0)) {
          pQVar21 = (QObject *)0x0;
        }
        else {
          pQVar21 = (this_00->controlContainer).wp.value;
        }
        if (((*(long *)(pQVar21 + 0x30) != 0) && (*(int *)(*(long *)(pQVar21 + 0x30) + 4) != 0)) &&
           (*(long *)(pQVar21 + 0x38) != 0)) {
          pQVar16 = QMenuBar::cornerWidget
                              (*(QMenuBar **)((this_00->controlContainer).wp.value + 0x38),
                               TopRightCorner);
          pQVar19 = maximizedButtonsWidget(this);
          if (pQVar16 == pQVar19) {
            pQVar16 = QWidget::window(&this->super_QWidget);
            bVar14 = QWidget::isWindowModified(&this->super_QWidget);
            QWidget::setWindowModified(pQVar16,bVar14);
          }
        }
      }
LAB_00458c0f:
      QMdiSubWindowPrivate::updateInternalWindowTitle(this_00);
      goto LAB_00458cb9;
    }
    if (uVar2 - 0x71 < 3) {
      QWidget::update(&this->super_QWidget);
      goto LAB_00458cb9;
    }
    if (uVar2 == 0x6e) {
      QMdiSubWindowPrivate::titleBarOptions((QStyleOptionTitleBar *)local_a8,this_00);
      showToolTip((QHelpEvent *)event,&this->super_QWidget,(QStyleOptionComplex *)local_a8,
                  CC_TitleBar,this_00->hoveredSubControl);
      QIcon::~QIcon(local_48);
      if (local_60 != (QArrayData *)0x0) {
        LOCK();
        (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_60,2,0x10);
        }
      }
      QStyleOption::~QStyleOption((QStyleOption *)local_a8);
      goto LAB_00458cb9;
    }
    if (uVar2 != 0x83) goto LAB_00458cb9;
LAB_00458b0f:
    bVar14 = false;
  }
  QMdiSubWindowPrivate::setActive(this_00,bVar14,true);
LAB_00458cb9:
  bVar14 = QWidget::event(&this->super_QWidget,event);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar14;
}

Assistant:

bool QMdiSubWindow::event(QEvent *event)
{
    Q_D(QMdiSubWindow);
    switch (event->type()) {
    case QEvent::StyleChange: {
        bool wasShaded = isShaded();
        bool wasMinimized = isMinimized();
        bool wasMaximized = isMaximized();
        // Don't emit subWindowActivated, the app doesn't have to know about our hacks
        const QScopedValueRollback<bool> activationEnabledSaver(d->activationEnabled);
        d->activationEnabled = false;

        ensurePolished();
        setContentsMargins(0, 0, 0, 0);
        if (wasMinimized || wasMaximized || wasShaded)
            showNormal();
        d->updateGeometryConstraints();
        resize(d->internalMinimumSize.expandedTo(size()));
        d->updateMask();
        d->updateDirtyRegions();
        if (wasShaded)
            showShaded();
        else if (wasMinimized)
            showMinimized();
        else if (wasMaximized)
            showMaximized();
        break;
    }
    case QEvent::ParentAboutToChange:
        d->setActive(false);
        break;
    case QEvent::ParentChange: {
        bool wasResized = testAttribute(Qt::WA_Resized);
#if QT_CONFIG(menubar)
        d->removeButtonsFromMenuBar();
#endif
        d->currentOperation = QMdiSubWindowPrivate::None;
        d->activeSubControl = QStyle::SC_None;
        d->hoveredSubControl = QStyle::SC_None;
#if QT_CONFIG(rubberband)
        if (d->isInRubberBandMode)
            d->leaveRubberBandMode();
#endif
        d->isShadeMode = false;
        d->isMaximizeMode = false;
        d->isWidgetHiddenByUs = false;
        if (!parent()) {
#if QT_CONFIG(sizegrip)
            if (isMacStyle(style()))
                delete d->sizeGrip;
#endif
            setOption(RubberBandResize, false);
            setOption(RubberBandMove, false);
        } else {
            d->setWindowFlags(windowFlags());
        }
        setContentsMargins(0, 0, 0, 0);
        d->updateGeometryConstraints();
        d->updateCursor();
        d->updateMask();
        d->updateDirtyRegions();
        d->updateActions();
        if (!wasResized && testAttribute(Qt::WA_Resized))
            setAttribute(Qt::WA_Resized, false);
        break;
    }
    case QEvent::WindowActivate:
        if (d->ignoreNextActivationEvent) {
            d->ignoreNextActivationEvent = false;
            break;
        }
        d->isExplicitlyDeactivated = false;
        d->setActive(true);
        break;
    case QEvent::WindowDeactivate:
        if (d->ignoreNextActivationEvent) {
            d->ignoreNextActivationEvent = false;
            break;
        }
        d->isExplicitlyDeactivated = true;
        d->setActive(false);
        break;
    case QEvent::WindowTitleChange:
        if (!d->ignoreWindowTitleChange)
            d->updateWindowTitle(false);
        d->updateInternalWindowTitle();
        break;
    case QEvent::ModifiedChange:
        if (!windowTitle().contains("[*]"_L1))
            break;
#if QT_CONFIG(menubar)
        if (maximizedButtonsWidget() && d->controlContainer->menuBar() && d->controlContainer->menuBar()
                ->cornerWidget(Qt::TopRightCorner) == maximizedButtonsWidget()) {
            window()->setWindowModified(isWindowModified());
        }
#endif // QT_CONFIG(menubar)
        d->updateInternalWindowTitle();
        break;
    case QEvent::LayoutDirectionChange:
        d->updateDirtyRegions();
        break;
    case QEvent::LayoutRequest:
        d->updateGeometryConstraints();
        break;
    case QEvent::WindowIconChange:
        d->menuIcon = windowIcon();
        if (d->menuIcon.isNull())
            d->menuIcon = style()->standardIcon(QStyle::SP_TitleBarMenuButton, nullptr, this);
        if (d->controlContainer)
            d->controlContainer->updateWindowIcon(d->menuIcon);
        if (!maximizedSystemMenuIconWidget())
            update(0, 0, width(), d->titleBarHeight());
        break;
    case QEvent::PaletteChange:
        d->titleBarPalette = d->desktopPalette();
        break;
    case QEvent::FontChange:
        d->font = font();
        break;
#if QT_CONFIG(tooltip)
    case QEvent::ToolTip:
        showToolTip(static_cast<QHelpEvent *>(event), this, d->titleBarOptions(),
                    QStyle::CC_TitleBar, d->hoveredSubControl);
        break;
#endif
#ifndef QT_NO_ACTION
    case QEvent::ActionAdded:
    case QEvent::ActionChanged:
    case QEvent::ActionRemoved:
        update();
        break;
#endif
    default:
        break;
    }
    return QWidget::event(event);
}